

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O1

int32_t __thiscall GameEngine::registerPlayer(GameEngine *this,string *name)

{
  size_type *psVar1;
  size_t __n;
  pointer pcVar2;
  element_type *this_00;
  uint uVar3;
  int iVar4;
  undefined8 *puVar5;
  uint uVar6;
  ulong uVar7;
  uint __val;
  uint __len;
  uint id;
  ulong uVar8;
  bool bVar9;
  shared_ptr<Player> player;
  string local_a0;
  shared_ptr<Player> local_80;
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  
  local_80.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_80.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
  (local_80.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count
       = 1;
  (local_80.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_weak_count
       = 1;
  (local_80.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00139928;
  local_80.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_80.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 1);
  local_80.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
  _vptr__Sp_counted_base = (_func_int **)0x0;
  local_80.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2]._M_use_count
       = 0;
  local_80.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2]._M_weak_count
       = 0;
  local_80.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
  _vptr__Sp_counted_base = (_func_int **)0x0;
  local_80.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3]._M_use_count
       = 0;
  local_80.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3]._M_weak_count
       = 0;
  local_80.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)0x0;
  local_80.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1]._M_use_count
       = 0;
  local_80.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1]._M_weak_count
       = 0;
  local_80.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
  _vptr__Sp_counted_base = (_func_int **)0x0;
  local_80.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4]._M_use_count
       = 0;
  local_80.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4]._M_weak_count
       = 0;
  *(_Atomic_word **)
   &local_80.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
    _M_use_count =
       &local_80.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
        _M_use_count;
  local_80.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
  _vptr__Sp_counted_base = (_func_int **)0x0;
  *(undefined1 *)
   &local_80.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
    _M_use_count = 0;
  uVar8 = (ulong)((long)(this->players).
                        super__Vector_base<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->players).
                       super__Vector_base<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 4;
  id = (uint)uVar8;
  Player::SetId(local_80.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_ptr,id);
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"Bot","");
  __n = name->_M_string_length;
  if (__n == local_a0._M_string_length) {
    if (__n == 0) {
      bVar9 = true;
    }
    else {
      iVar4 = bcmp((name->_M_dataplus)._M_p,local_a0._M_dataplus._M_p,__n);
      bVar9 = iVar4 == 0;
    }
  }
  else {
    bVar9 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  this_00 = local_80.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (!bVar9) {
    Player::SetName(local_80.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_ptr,name);
    goto LAB_001276be;
  }
  local_70 = local_60;
  pcVar2 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + name->_M_string_length);
  std::__cxx11::string::append((char *)&local_70);
  __val = -id;
  if (0 < (int)id) {
    __val = id;
  }
  __len = 1;
  if (9 < __val) {
    uVar7 = (ulong)__val;
    uVar3 = 4;
    do {
      __len = uVar3;
      uVar6 = (uint)uVar7;
      if (uVar6 < 100) {
        __len = __len - 2;
        goto LAB_00127584;
      }
      if (uVar6 < 1000) {
        __len = __len - 1;
        goto LAB_00127584;
      }
      if (uVar6 < 10000) goto LAB_00127584;
      uVar7 = uVar7 / 10000;
      uVar3 = __len + 4;
    } while (99999 < uVar6);
    __len = __len + 1;
  }
LAB_00127584:
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)__len - ((char)(uVar8 >> 0x18) >> 7));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(id >> 0x1f) + (long)local_50),__len,__val);
  uVar8 = 0xf;
  if (local_70 != local_60) {
    uVar8 = local_60[0];
  }
  if (uVar8 < (ulong)(local_48 + local_68)) {
    uVar8 = 0xf;
    if (local_50 != local_40) {
      uVar8 = local_40[0];
    }
    if (uVar8 < (ulong)(local_48 + local_68)) goto LAB_00127600;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_00127600:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_50);
  }
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  psVar1 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_a0.field_2._M_allocated_capacity = *psVar1;
    local_a0.field_2._8_8_ = puVar5[3];
  }
  else {
    local_a0.field_2._M_allocated_capacity = *psVar1;
    local_a0._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_a0._M_string_length = puVar5[1];
  *puVar5 = psVar1;
  puVar5[1] = 0;
  *(undefined1 *)psVar1 = 0;
  Player::SetName(this_00,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
LAB_001276be:
  Player::generatePopulations
            (local_80.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::vector<std::shared_ptr<Player>,std::allocator<std::shared_ptr<Player>>>::
  emplace_back<std::shared_ptr<Player>>
            ((vector<std::shared_ptr<Player>,std::allocator<std::shared_ptr<Player>>> *)
             &this->players,&local_80);
  if (local_80.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return id;
}

Assistant:

int32_t GameEngine::registerPlayer(const std::string &name) {
  std::shared_ptr<Player> player = std::make_shared<Player>();
  int32_t id = players.size();
  player->SetId(id);

  if (name == std::string("Bot")) {
    player->SetName(name + " " + std::to_string(id));
  } else {
    player->SetName(name);
  }

  player->generatePopulations();

  players.push_back(std::move(player));

  return id;
}